

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::
numeric_specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
::check_sign(numeric_specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
             *this)

{
  bool bVar1;
  long in_RDI;
  allocator local_29;
  string local_28 [16];
  string *in_stack_ffffffffffffffe8;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffffff0;
  
  require_numeric_argument
            ((numeric_specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
              *)in_stack_fffffffffffffff0);
  bVar1 = is_integral_type(*(type *)(in_RDI + 8));
  if ((((bVar1) && (*(int *)(in_RDI + 8) != 2)) && (*(int *)(in_RDI + 8) != 4)) &&
     (*(int *)(in_RDI + 8) != 9)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"format specifier requires signed argument",&local_29);
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<wchar_t,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_error(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != int_type &&
        arg_type_ != long_long_type && arg_type_ != internal::char_type) {
      error_handler_.on_error("format specifier requires signed argument");
    }
  }